

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

int multishot_max(monst *mtmp,obj *otmp)

{
  byte bVar1;
  char cVar2;
  short sVar3;
  uint uVar4;
  obj *poVar5;
  xchar xVar6;
  int iVar7;
  bool bVar8;
  obj **ppoVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  if (mtmp == (monst *)0x0) {
    return 1;
  }
  sVar3 = otmp->otyp;
  bVar1 = objects[sVar3].oc_subtyp;
  iVar10 = (int)(char)bVar1;
  if (mtmp == &youmonst) {
    ppoVar9 = &uwep;
  }
  else {
    ppoVar9 = &mtmp->mw;
  }
  poVar5 = *ppoVar9;
  cVar2 = otmp->oclass;
  if ((cVar2 == '\r') || (cVar2 == '\x02')) {
    if (((char)bVar1 < -0x18) ||
       ((poVar5 == (obj *)0x0 || -0x16 < (char)bVar1 ||
        (objects[poVar5->otyp].oc_subtyp + iVar10 != 0)))) {
      if (cVar2 != '\x02') goto LAB_0017e2c9;
      if ((byte)(bVar1 + 0x18) < 3) {
        if ((poVar5 != (obj *)0x0) && (objects[poVar5->otyp].oc_subtyp + iVar10 == 0))
        goto LAB_0017e2f1;
      }
      else {
        if ((bVar1 & 0xfe) == 0x12) goto LAB_0017e31e;
LAB_0017e2f1:
        uVar4 = bVar1 - 0xe5;
        if (((uVar4 < 4) && (uVar4 != 2)) || (bVar1 == 1)) goto LAB_0017e31e;
      }
      if ((bVar1 & 0xfe) != 0xe6) {
        return 1;
      }
    }
  }
  else {
LAB_0017e2c9:
    if ((1 < bVar1 - 0xe6) && (bVar1 != 1)) {
      return 1;
    }
  }
LAB_0017e31e:
  if (mtmp == &youmonst) {
    if (u.uprops[0x1c].intrinsic != 0) {
      return 1;
    }
    if (u.uprops[0x1b].intrinsic != 0) {
      return 1;
    }
    if (u.umonnum == 0x9e) {
      return 1;
    }
    if ((youmonst.data)->mlet == '\x1c') {
      return 1;
    }
  }
  else if ((mtmp->field_0x62 & 0x30) != 0) {
    return 1;
  }
  if ((((cVar2 == '\r') || (iVar11 = 0, cVar2 == '\x02')) && (iVar11 = 0, -0x19 < (char)bVar1)) &&
     (poVar5 != (obj *)0x0 && (char)bVar1 < -0x15)) {
    iVar11 = (int)poVar5->otyp;
    if (objects[(int)poVar5->otyp].oc_subtyp + iVar10 != 0) {
      iVar11 = 0;
    }
  }
  iVar10 = weapon_type(otmp);
  xVar6 = mon_skill_level(iVar10,mtmp);
  iVar10 = 3;
  if (xVar6 != '\x04') {
    iVar10 = (xVar6 == '\x03') + 1;
  }
  if (bVar1 == 0x13) {
    iVar10 = iVar10 + (uint)('\x01' < u.weapon_skills[0x13].skill || mtmp != &youmonst);
  }
  if (mtmp == &youmonst) {
    iVar7 = (int)urole.malenum;
  }
  else {
    iVar7 = monsndx(mtmp->data);
  }
  if (iVar7 < 0x165) {
    if (iVar7 == 0x163) {
      iVar10 = iVar10 + 1;
    }
    else if (iVar7 == 0x164) {
      bVar12 = bVar1 == 1;
      goto LAB_0017e475;
    }
  }
  else if ((iVar7 == 0x165) || (iVar7 == 0x18e)) {
    bVar12 = iVar11 == 0x45 && sVar3 == 5;
LAB_0017e475:
    iVar10 = iVar10 + (uint)bVar12;
  }
  if (mtmp == &youmonst) {
    if (urace.malenum == 0x2d) {
LAB_0017e4cd:
      bVar12 = sVar3 == 0xd;
      goto LAB_0017e4f7;
    }
    if (urace.malenum == 0x4a) goto LAB_0017e4d9;
    if (urace.malenum != 0x111) {
      return iVar10;
    }
LAB_0017e4b5:
    bVar8 = iVar11 == 0x43 && sVar3 == 2;
    bVar12 = sVar3 == 0xb;
  }
  else {
    uVar4 = mtmp->data->mflags2;
    if ((uVar4 & 0x10) != 0) goto LAB_0017e4b5;
    if ((uVar4 & 0x20) != 0) goto LAB_0017e4cd;
    if (-1 < (char)uVar4) {
      return iVar10;
    }
LAB_0017e4d9:
    bVar8 = iVar11 == 0x44 && sVar3 == 3;
    bVar12 = sVar3 == 0xc;
  }
  bVar12 = (bool)(bVar12 | bVar8);
LAB_0017e4f7:
  return iVar10 + (uint)bVar12;
}

Assistant:

int multishot_max(const struct monst *mtmp, const struct obj *otmp)
{
	boolean you_shot;
	schar skill;
	const struct obj *wwep;
	int multishot = 1;

	if (!mtmp)
	    return 1;

	you_shot = (mtmp == &youmonst);

	skill = objects[otmp->otyp].oc_skill;
	wwep = you_shot ? uwep : MON_WEP(mtmp);

	if ((ammo_and_launcher(otmp, wwep) || is_heavyshot(otmp, wwep) ||
	     skill == P_DAGGER || skill == -P_DART || skill == -P_SHURIKEN) &&
	    !(you_shot ? (Confusion || Stunned) :
			 (mtmp->mconf || mtmp->mstun))) {
	    short otyp, lotyp;
	    xchar sklev;
	    otyp = otmp->otyp;
	    lotyp = ammo_and_launcher(otmp, wwep) ? wwep->otyp : 0;
	    sklev = mon_skill_level(weapon_type(otmp), mtmp);

	    /* bonus for skill */
	    if (sklev == P_EXPERT) {
		multishot += 2;
	    } else if (sklev == P_SKILLED) {
		multishot++;
	    }

	    /* bonus for javelins so they're not just inferior spears */
	    if (skill == P_JAVELIN && (!you_shot || P_SKILL(P_JAVELIN) >= P_BASIC))
		multishot++;

	    /* bonus for role */
	    switch (you_shot ? Role_switch :
			       monsndx(mtmp->data)) {
	    case PM_RANGER:
		multishot++;
		break;
	    case PM_ROGUE:
		if (skill == P_DAGGER)
		    multishot++;
		break;
	    case PM_NINJA: /* for monsters */
	    case PM_SAMURAI:
		if (otyp == YA && lotyp == YUMI)
		    multishot++;
		break;
	    default:
		break;	/* No bonus */
	    }

	    /* bonus for race */
	    if (you_shot ? (Race_switch == PM_ELF) :
			   is_elf(mtmp->data)) {
		if ((otyp == ELVEN_ARROW && lotyp == ELVEN_BOW) ||
		    otyp == ELVEN_SPEAR)
		    multishot++;
	    } else if (you_shot ? (Race_switch == PM_DWARF) :
				  is_dwarf(mtmp->data)) {
		if (otyp == DWARVISH_SPEAR)
		    multishot++;
	    } else if (you_shot ? (Race_switch == PM_ORC) :
				  is_orc(mtmp->data)) {
		if ((otyp == ORCISH_ARROW && lotyp == ORCISH_BOW) ||
		    otyp == ORCISH_SPEAR)
		    multishot++;
	    }
	}

	return multishot;
}